

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd_cgap.h
# Opt level: O2

void __thiscall
bwtil::bsd_cgap::build
          (bsd_cgap *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *gaps,bool last,
          cgap_dictionary *D)

{
  pointer puVar1;
  ulint g;
  byte bVar2;
  size_t size;
  ulong uVar3;
  undefined7 in_register_00000011;
  long lVar4;
  word_type value;
  ulong uVar5;
  long lVar6;
  unsigned_long x;
  ulint i_1;
  ulong uVar7;
  size_type __n;
  reference rVar8;
  value_type local_c0;
  vector<bool,_std::allocator<bool>_> code;
  range_reference<bv::internal::bitview<std::vector>_> local_48;
  
  this->W = '@';
  this->D = D;
  puVar1 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if ((int)CONCAT71(in_register_00000011,last) == 0) {
    x = puVar1[uVar3 - 1];
    uVar7 = uVar3 - 1;
  }
  else {
    x = 0;
    uVar7 = uVar3;
  }
  this->tail = x;
  this->n = uVar7;
  this->u = x;
  uVar5 = (CONCAT71(in_register_00000011,last) ^ 1) & 0xff;
  lVar6 = -uVar5;
  for (lVar4 = 0; uVar3 - uVar5 != lVar4; lVar4 = lVar4 + 1) {
    x = x + puVar1[lVar4];
    this->u = x;
  }
  bVar2 = intlog2(x);
  this->logu = bVar2;
  uVar3 = 2;
  if (bVar2 != 0) {
    uVar3 = (ulong)((uint)bVar2 + (uint)bVar2 * 4);
  }
  this->t = (uint)uVar3;
  size = (uVar7 / uVar3 + 1) - (ulong)(uVar7 % uVar3 == 0);
  this->number_of_blocks = size;
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)&code,(ulong)bVar2,size);
  bv::internal::packed_view<std::vector>::operator=
            (&this->first_el,(packed_view<std::vector> *)&code);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&code);
  this->c = 0;
  for (uVar3 = 0;
      puVar1 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(gaps->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) + lVar6)
      ; uVar3 = uVar3 + 1) {
    if (uVar3 % (ulong)this->t != 0) {
      cgap_dictionary::encode(&code,D,puVar1[uVar3]);
      this->c = (ulong)code.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                this->c + ((long)code.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                          (long)code.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8
      ;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&code);
    }
  }
  bv::internal::bitview<std::vector>::bitview<unsigned_long,void>
            ((bitview<std::vector> *)&code,this->c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&(this->C)._container,(item_reference<bv::internal::packed_view<std::vector>_> *)&code)
  ;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&code);
  bVar2 = intlog2(this->c);
  this->logc = bVar2;
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)&code,(ulong)bVar2,this->number_of_blocks);
  bv::internal::packed_view<std::vector>::operator=(&this->C_addr,(packed_view<std::vector> *)&code)
  ;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&code);
  lVar4 = 0;
  local_c0 = 0;
  for (uVar3 = 0;
      puVar1 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(gaps->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) + lVar6)
      ; uVar3 = uVar3 + 1) {
    g = puVar1[uVar3];
    lVar4 = lVar4 + g;
    if (uVar3 % (ulong)this->t == 0) {
      code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)&this->first_el;
      code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._8_8_ = uVar3 / this->t;
      bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                ((item_reference<bv::internal::packed_view<std::vector>_> *)&code,lVar4 - 1);
      code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._8_8_ = uVar3 / this->t;
      code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)&this->C_addr;
      bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                ((item_reference<bv::internal::packed_view<std::vector>_> *)&code,local_c0);
    }
    else {
      cgap_dictionary::encode(&code,D,g);
      value = 0;
      uVar7 = (ulong)code.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)code.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_start.super__Bit_iterator_base._M_p) * 8;
      for (__n = 0; (uVar7 & 0xffffffff) != __n; __n = __n + 1) {
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&code,__n);
        value = (ulong)((*rVar8._M_p & rVar8._M_mask) != 0) + value * 2;
      }
      uVar7 = uVar7 & 0xffffffff;
      local_48._end = this->c - local_c0;
      local_48._begin = local_48._end - uVar7;
      local_48._v = &this->C;
      bv::internal::range_reference<bv::internal::bitview<std::vector>_>::operator=(&local_48,value)
      ;
      local_c0 = local_c0 + uVar7;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&code);
    }
  }
  return;
}

Assistant:

void build(vector<ulint> &gaps,bool last, cgap_dictionary * D){

		assert(gaps.size()>0);

		W = sizeof(ulint)*8;

		this->D=D;
		if(last) last=1;

		if(last){

			tail=0;
			n=gaps.size();

		}else{

			tail=gaps[gaps.size()-1];
			n=gaps.size()-1;

		}

		//cout << "n = " << (ulint)n<<endl;

		u = tail;

		//count bits and ones
		for(ulint i=0;i<(gaps.size()-1)+last;++i)
			u+=gaps[i];

		assert(u>0);

		//cout << "u = " << (ulint)u<<endl;

		logu = intlog2(u);

		//compute block size
		t = 5*logu;
		if(t<2) t = 2;

		number_of_blocks = n/t + (n%t!=0);
		first_el = packed_view<vector>(logu,number_of_blocks);

		c=0;

		//count number of bits in C
		for(ulint i=0;i<(gaps.size()-1)+last;++i){

			if(i%t!=0)
				c+=D->encode(gaps[i]).size();

		}

		C = bitview<vector>(c);
		logc = intlog2(c);

		//cout << "log c = " << (ulint)logc<<endl;
		//cout << "log u = " << (ulint)logu<<endl;
		//cout << "t = " << (ulint)t<<endl;

		C_addr = packed_view<vector>(logc,number_of_blocks);

		ulint cumulative_u = 0;
		ulint cumulative_c = 0;

		for(ulint i=0;i<(gaps.size()-1)+last;++i){

			cumulative_u+=gaps[i];

			if(i%t==0){

				assert(cumulative_u>0);
				assert(cumulative_u-1<(ulint(1)<<logu));
				assert(cumulative_c<(ulint(1)<<logc));

				first_el[i/t] = cumulative_u-1;
				C_addr[i/t] = cumulative_c;

			}else{

				auto code = D->encode(gaps[i]);
				uint l = code.size();

				ulint code_ul=0;

				for(uint j=0;j<l;j++)
					code_ul = code_ul*2+code[j];

				assert(code_ul<(ulint(1)<<l));

				//transform to access correctly C:
				//interval [i,i+l) -> [(c-i)-l,c-i)

				assert(c>=(cumulative_c+l));
				ulint left = (c - cumulative_c)-l;
				ulint right = c - cumulative_c;

				C(left,right) = code_ul;

				cumulative_c+=l;

			}

		}

		//cout << "c = " << (ulint)c<<endl;

		/*cout << "first el : "<<endl;
		for(auto i : first_el)
			cout << i << endl;*/

	}